

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O3

s32 __thiscall
irr::gui::CGUITabControl::insertTab
          (CGUITabControl *this,s32 idx,IGUITab *tab,bool serializationMode)

{
  _func_int *p_Var1;
  int iVar2;
  pointer ppIVar3;
  ulong uVar4;
  int iVar5;
  IGUITab *local_40;
  IGUITab *local_38;
  
  if (tab == (IGUITab *)0x0) {
    return -1;
  }
  if ((int)((ulong)((long)(this->Tabs).m_data.
                          super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->Tabs).m_data.
                         super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) < idx &&
      !serializationMode) {
    return -1;
  }
  local_38 = tab;
  iVar2 = (**(code **)(*(long *)this + 0x160))(this,tab);
  if (-1 < iVar2) {
    return -1;
  }
  uVar4 = (ulong)((long)(this->Tabs).m_data.
                        super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->Tabs).m_data.
                       super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  if (-1 < idx) {
    uVar4 = (ulong)(uint)idx;
  }
  iVar2 = (int)uVar4;
  if ((CGUITabControl *)(tab->super_IGUIElement).Parent != this) {
    IGUIElement::addChildToEnd((IGUIElement *)this,&tab->super_IGUIElement);
  }
  (*(tab->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0xf])(tab,0);
  p_Var1 = (_func_int *)
           ((long)&(tab->super_IGUIElement).Children.
                   super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                   ._M_impl._M_node.super__List_node_base._M_prev +
           (long)(tab->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3]);
  *(int *)p_Var1 = *(int *)p_Var1 + 1;
  if (serializationMode) {
    ppIVar3 = (this->Tabs).m_data.
              super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->Tabs).m_data.
                            super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar3) >> 3) <=
        iVar2) {
      do {
        local_40 = (IGUITab *)0x0;
        ::std::vector<irr::gui::IGUITab*,std::allocator<irr::gui::IGUITab*>>::
        emplace_back<irr::gui::IGUITab*>
                  ((vector<irr::gui::IGUITab*,std::allocator<irr::gui::IGUITab*>> *)&this->Tabs,
                   &local_40);
        (this->Tabs).is_sorted = false;
        ppIVar3 = (this->Tabs).m_data.
                  super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while ((int)((ulong)((long)(this->Tabs).m_data.
                                   super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar3) >> 3)
               <= iVar2);
    }
    ppIVar3[uVar4] = tab;
    if (iVar2 == this->ActiveTabIndex) {
      setVisibleTab(this,iVar2);
      (*(tab->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0xf])(tab,1);
    }
  }
  else {
    ::std::vector<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>::insert
              (&(this->Tabs).m_data,
               (const_iterator)
               ((this->Tabs).m_data.
                super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                _M_impl.super__Vector_impl_data._M_start + uVar4),&local_38);
    (this->Tabs).is_sorted = false;
    iVar5 = this->ActiveTabIndex;
    if (iVar5 == -1) {
      this->ActiveTabIndex = iVar2;
      iVar5 = iVar2;
    }
    else {
      if (iVar5 < iVar2) goto LAB_00226553;
      this->ActiveTabIndex = iVar5 + 1;
      iVar5 = iVar5 + 1;
    }
    setVisibleTab(this,iVar5);
  }
LAB_00226553:
  recalculateScrollBar(this);
  return iVar2;
}

Assistant:

s32 CGUITabControl::insertTab(s32 idx, IGUITab *tab, bool serializationMode)
{
	if (!tab)
		return -1;
	if (idx > (s32)Tabs.size() && !serializationMode) // idx == Tabs.size() is indeed OK here as core::array can handle that
		return -1;
	// Not allowing to add same tab twice as it would make things complicated (serialization or setting active visible)
	if (getTabIndex(tab) >= 0)
		return -1;

	if (idx < 0)
		idx = (s32)Tabs.size();

	if (tab->getParent() != this)
		this->addChildToEnd(tab);

	tab->setVisible(false);

	tab->grab();

	if (serializationMode) {
		while (idx >= (s32)Tabs.size()) {
			Tabs.push_back(0);
		}
		Tabs[idx] = tab;

		if (idx == ActiveTabIndex) { // in serialization that can happen for any index
			setVisibleTab(ActiveTabIndex);
			tab->setVisible(true);
		}
	} else {
		Tabs.insert(tab, (u32)idx);

		if (ActiveTabIndex == -1) {
			ActiveTabIndex = idx;
			setVisibleTab(ActiveTabIndex);
		} else if (idx <= ActiveTabIndex) {
			++ActiveTabIndex;
			setVisibleTab(ActiveTabIndex);
		}
	}

	recalculateScrollBar();

	return idx;
}